

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O1

Am_Wrapper * __thiscall Store_Data::Make_Unique(Store_Data *this)

{
  int iVar1;
  Store_Data *pSVar2;
  
  pSVar2 = this;
  if (*(int *)&this->field_0x8 != 1) {
    iVar1 = *(int *)&this->field_0x8 + -1;
    *(int *)&this->field_0x8 = iVar1;
    if (iVar1 == 0) {
      (**(code **)(*(long *)this + 0x20))(this);
    }
    pSVar2 = (Store_Data *)operator_new(0x10);
    *(undefined4 *)&pSVar2->field_0x8 = 1;
    *(undefined ***)pSVar2 = &PTR_ID_00117c20;
    pSVar2->datum = this->datum;
  }
  return &pSVar2->super_Am_Wrapper;
}

Assistant:

Am_Define_No_Self_Formula(const char *, retstr)
{
  Store_Data *store =
      (Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  data_test = store->datum;
  return "hello";
}